

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O3

BoolExpr * make_boolean_expr(List *ls)

{
  TokenType TVar1;
  List *pLVar2;
  char *pcVar3;
  BoolExpr *pBVar4;
  uint uVar5;
  char *fmt;
  bool bVar6;
  char buf [128];
  char acStack_88 [128];
  
  if (ls == (List *)0x0) {
    parse_error((List *)0x0,"Invalid boolean expression.\n");
    goto LAB_00108884;
  }
  pLVar2 = ls->car;
  if (pLVar2 == (List *)0x0) {
    TVar1 = (ls->token).type;
    if (TVar1 == TOK_NIL) goto LAB_00108884;
    if (TVar1 == TOK_TRUE) {
      return &true_bool_expr;
    }
    if (TVar1 == TOK_FALSE) goto LAB_00108884;
    pcVar3 = unparse_token(&ls->token,acStack_88);
    fmt = "Unknown boolean expression \"%s\".\n";
  }
  else {
    uVar5 = 9;
    do {
      if (make_boolean_expr::boolop[uVar5].type == (pLVar2->token).type) {
        pBVar4 = (*make_boolean_expr::boolop[uVar5].func)(pLVar2);
        return pBVar4;
      }
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar6);
    pcVar3 = unparse_token(&pLVar2->token,acStack_88);
    fmt = "Unknown boolean operator: \"%s\"\n";
  }
  parse_error(ls,fmt,pcVar3);
LAB_00108884:
  return &false_bool_expr;
}

Assistant:

BoolExpr *
make_boolean_expr (const List *ls)
{
  char buf[128];
  int i;
  static const BoolDispatchEntry boolop[] = {
    { TOK_EQUAL,            BO_equal         },
    { TOK_GREATER_THAN,     BO_greater_than  },
    { TOK_LESS_THAN,        BO_less_than     },
    { TOK_LESS_OR_EQUAL,    BO_less_or_equal },
    { TOK_GREATER_OR_EQUAL, BO_gr_or_equal   },
    { TOK_NOT_EQUAL,        BO_not_equal     },
    { TOK_NOT,              BO_not           },
    { TOK_AND,              BO_and           },
    { TOK_OR,               BO_or            },
    { TOK_XOR,              BO_xor           } };

  if (ls == NULL)
    parse_error(ls, "Invalid boolean expression.\n");
  else if (ls->car == NULL)
    {
      switch (ls->token.type) {
      case TOK_TRUE:
	return &true_bool_expr;
      case TOK_FALSE:
      case TOK_NIL:
	return &false_bool_expr;
      default:
	break;
      }
      parse_error (ls, "Unknown boolean expression \"%s\".\n",
		   unparse_token (&ls->token, buf));
    }
  else
    {
      for (i = (sizeof boolop / sizeof boolop[0]) - 1; i >= 0; i--)
	if (boolop[i].type == ls->car->token.type)
	  return boolop[i].func (ls->car);
      parse_error (ls, "Unknown boolean operator: \"%s\"\n",
		   unparse_token (&ls->car->token, buf));
    }

  return &false_bool_expr;   /* Default to FALSE, keep compiling */
}